

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext
          (FunctionCreationContext *this)

{
  TranslateToFuzzReader *this_00;
  Expression *right;
  bool bVar1;
  reference puVar2;
  LocalSet *left;
  Block *pBVar3;
  Builder *this_01;
  optional<wasm::Type> type;
  undefined1 local_80 [12];
  uintptr_t local_70;
  Expression *local_68;
  Expression *value;
  iterator iStack_58;
  uint index;
  iterator __end1;
  iterator __begin1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range1;
  LocalStructuralDominance info;
  FunctionCreationContext *this_local;
  
  wasm::LocalStructuralDominance::LocalStructuralDominance
            ((LocalStructuralDominance *)&__range1,this->func,this->parent->wasm,NonNullableOnly);
  __end1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &__range1);
  iStack_58 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end1);
    value._4_4_ = *puVar2;
    bVar1 = oneIn(this->parent,5);
    if (!bVar1) {
      this_00 = this->parent;
      local_70 = wasm::Function::getLocalType((uint)this->func);
      local_68 = makeTrivial(this_00,(Type)local_70);
      this_01 = &this->parent->builder;
      left = Builder::makeLocalSet(this_01,value._4_4_,local_68);
      right = this->func->body;
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_80);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_80._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_80[8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_80._9_3_;
      pBVar3 = Builder::makeSequence(this_01,(Expression *)left,right,type);
      this->func->body = (Expression *)pBVar3;
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end1);
  }
  wasm::TypeUpdating::handleNonDefaultableLocals(this->func,this->parent->wasm);
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->breakableStack);
  if (!bVar1) {
    __assert_fail("breakableStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4b2,
                  "wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext()"
                 );
  }
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->hangStack);
  if (!bVar1) {
    __assert_fail("hangStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4b3,
                  "wasm::TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext()"
                 );
  }
  this->parent->funcContext = (FunctionCreationContext *)0x0;
  LocalStructuralDominance::~LocalStructuralDominance((LocalStructuralDominance *)&__range1);
  std::
  unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~unordered_map(&this->typeLocals);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&this->hangStack);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            (&this->breakableStack);
  return;
}

Assistant:

TranslateToFuzzReader::FunctionCreationContext::~FunctionCreationContext() {
  // We must ensure non-nullable locals validate. Later down we'll run
  // TypeUpdating::handleNonDefaultableLocals which will make them validate by
  // turning them nullable + add ref.as_non_null to fix up types. That has the
  // downside of making them trap at runtime, however, and also we lose the non-
  // nullability in the type, so we prefer to do a manual fixup that avoids a
  // trap, which we do by writing a non-nullable value into the local at the
  // function entry.
  // TODO: We could be more precise and use a LocalGraph here, at the cost of
  //       doing more work.
  LocalStructuralDominance info(
    func, parent.wasm, LocalStructuralDominance::NonNullableOnly);
  for (auto index : info.nonDominatingIndices) {
    // Do not always do this, but with high probability, to reduce the amount of
    // traps.
    if (!parent.oneIn(5)) {
      auto* value = parent.makeTrivial(func->getLocalType(index));
      func->body = parent.builder.makeSequence(
        parent.builder.makeLocalSet(index, value), func->body);
    }
  }

  // Then, to handle remaining cases we did not just fix up, do the general
  // fixup to ensure we validate.
  TypeUpdating::handleNonDefaultableLocals(func, parent.wasm);

  assert(breakableStack.empty());
  assert(hangStack.empty());
  parent.funcContext = nullptr;
}